

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::ProgramInterfaceQueryTestCase::getMaxPatchVertices
          (ProgramInterfaceQueryTestCase *this)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  int local_1c;
  long lStack_18;
  GLint maxPatchVertices;
  Functions *gl;
  ProgramInterfaceQueryTestCase *this_local;
  
  gl = (Functions *)this;
  pRVar2 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar1);
  local_1c = 0;
  (**(code **)(lStack_18 + 0x868))(0x8e7d,&local_1c);
  err = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(err,"getIntegerv(GL_MAX_PATCH_VERTICES)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTestCase.cpp"
                  ,0x84f);
  return local_1c;
}

Assistant:

int ProgramInterfaceQueryTestCase::getMaxPatchVertices (void)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	glw::GLint				maxPatchVertices	= 0;

	gl.getIntegerv(GL_MAX_PATCH_VERTICES, &maxPatchVertices);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getIntegerv(GL_MAX_PATCH_VERTICES)");
	return maxPatchVertices;
}